

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcdsp(char *tform,char *cform)

{
  char *pcVar1;
  bool bVar2;
  int local_1c;
  int ii;
  char *cform_local;
  char *tform_local;
  
  *cform = '\0';
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (tform[local_1c] != '\0') {
      bVar2 = tform[local_1c] == ' ';
    }
    if (!bVar2) break;
    local_1c = local_1c + 1;
  }
  if (tform[local_1c] == '\0') {
    *cform = '\0';
  }
  else {
    pcVar1 = strchr(tform + local_1c,0x25);
    if (pcVar1 == (char *)0x0) {
      *cform = '%';
      strcpy(cform + 1,tform + (local_1c + 1));
      if ((tform[local_1c] == 'A') || (tform[local_1c] == 'a')) {
        strcat(cform,"s");
      }
      else if ((tform[local_1c] == 'I') || (tform[local_1c] == 'i')) {
        strcat(cform,"d");
      }
      else if ((tform[local_1c] == 'O') || (tform[local_1c] == 'o')) {
        strcat(cform,"o");
      }
      else if ((tform[local_1c] == 'Z') || (tform[local_1c] == 'z')) {
        strcat(cform,"X");
      }
      else if ((tform[local_1c] == 'F') || (tform[local_1c] == 'f')) {
        strcat(cform,"f");
      }
      else if ((tform[local_1c] == 'E') || (tform[local_1c] == 'e')) {
        strcat(cform,"E");
      }
      else if ((tform[local_1c] == 'D') || (tform[local_1c] == 'd')) {
        strcat(cform,"E");
      }
      else if ((tform[local_1c] == 'G') || (tform[local_1c] == 'g')) {
        strcat(cform,"G");
      }
      else {
        *cform = '\0';
      }
    }
    else {
      *cform = '\0';
    }
  }
  return;
}

Assistant:

void ffcdsp(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS TDISPn display format into the equivalent C format
  suitable for use in a printf statement.
*/
{
    int ii;

    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
    {
        cform[0] = '\0';
        return;    /* input format string was blank */
    }

    if (strchr(tform+ii, '%'))  /* is there a % character in the string?? */
    {
        cform[0] = '\0';
        return;    /* illegal TFORM string (possibly even harmful) */
    }

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[ii + 1]); /* append the width and decimal code */

    if      (tform[ii] == 'A' || tform[ii] == 'a')
        strcat(cform, "s");
    else if (tform[ii] == 'I' || tform[ii] == 'i')
        strcat(cform, "d");
    else if (tform[ii] == 'O' || tform[ii] == 'o')
        strcat(cform, "o");
    else if (tform[ii] == 'Z' || tform[ii] == 'z')
        strcat(cform, "X");
    else if (tform[ii] == 'F' || tform[ii] == 'f')
        strcat(cform, "f");
    else if (tform[ii] == 'E' || tform[ii] == 'e')
        strcat(cform, "E");
    else if (tform[ii] == 'D' || tform[ii] == 'd')
        strcat(cform, "E");
    else if (tform[ii] == 'G' || tform[ii] == 'g')
        strcat(cform, "G");
    else
        cform[0] = '\0';  /* unrecognized tform code */

    return;
}